

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3ae8d8::PEMTest_NoRC4_Test::~PEMTest_NoRC4_Test(PEMTest_NoRC4_Test *this)

{
  PEMTest_NoRC4_Test *this_local;
  
  ~PEMTest_NoRC4_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PEMTest, NoRC4) {
  static const char kPEM[] =
      "-----BEGIN RSA PUBLIC KEY-----\n"
      "Proc-Type: 4,ENCRYPTED\n"
      "DEK-Info: RC4 -\n"
      "extra-info\n"
      "router-signature\n"
      "\n"
      "Z1w=\n"
      "-----END RSA PUBLIC KEY-----\n";
  bssl::UniquePtr<BIO> bio(BIO_new_mem_buf(kPEM, sizeof(kPEM) - 1));
  ASSERT_TRUE(bio);
  bssl::UniquePtr<RSA> rsa(PEM_read_bio_RSAPublicKey(
      bio.get(), nullptr, nullptr, const_cast<char *>("password")));
  EXPECT_FALSE(rsa);
  EXPECT_TRUE(
      ErrorEquals(ERR_get_error(), ERR_LIB_PEM, PEM_R_UNSUPPORTED_ENCRYPTION));
}